

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_monte_carlo.cpp
# Opt level: O0

double * triangle01_sample(int n,int *seed)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *pdVar3;
  double *a;
  double dVar4;
  double *x;
  int local_30;
  int m;
  int j;
  int i;
  double e_sum;
  double *e;
  int *seed_local;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(n << 1);
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  pdVar3 = (double *)operator_new__(uVar2);
  for (local_30 = 0; local_30 < n; local_30 = local_30 + 1) {
    a = r8vec_uniform_01_new(3,seed);
    for (m = 0; m < 3; m = m + 1) {
      dVar4 = log(a[m]);
      a[m] = -dVar4;
    }
    dVar4 = r8vec_sum(3,a);
    for (m = 0; m < 2; m = m + 1) {
      pdVar3[m + local_30 * 2] = a[m] / dVar4;
    }
    if (a != (double *)0x0) {
      operator_delete__(a);
    }
  }
  return pdVar3;
}

Assistant:

double *triangle01_sample ( int n, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    TRIANGLE01_SAMPLE samples from the interior of the unit triangle in 2D.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 January 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Reuven Rubinstein,
//    Monte Carlo Optimization, Simulation, and Sensitivity
//    of Queueing Networks,
//    Krieger, 1992,
//    ISBN: 0894647644,
//    LC: QA298.R79.
//
//  Parameters:
//
//    Input, int N, the number of points.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, double TRIANGLE01_SAMPLE[2*N], the points.
//
{
  double *e;
  double e_sum;
  int i;
  int j;
  const int m = 2;
  double *x;

  x = new double[m*n];

  for ( j = 0; j < n; j++ )
  {
    e = r8vec_uniform_01_new ( m + 1, seed );

    for ( i = 0; i < m + 1; i++ )
    {
      e[i] = - log ( e[i] );
    }

    e_sum = r8vec_sum ( m + 1, e );

    for ( i = 0; i < m; i++ )
    {
      x[i+j*m] = e[i] / e_sum;
    }
    delete [] e;
  }

  return x;
}